

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindFileCommand.cxx
# Opt level: O1

void __thiscall
cmFindFileCommand::cmFindFileCommand(cmFindFileCommand *this,cmExecutionStatus *status)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"find_file","");
  cmFindPathCommand::cmFindPathCommand(&this->super_cmFindPathCommand,&local_40,status);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_cmFindPathCommand).super_cmFindBase._vptr_cmFindBase =
       (_func_int **)&PTR__cmFindBase_008ccc10;
  (this->super_cmFindPathCommand).IncludeFileInPath = true;
  (this->super_cmFindPathCommand).super_cmFindBase.VariableType = FILEPATH;
  return;
}

Assistant:

cmFindFileCommand::cmFindFileCommand(cmExecutionStatus& status)
  : cmFindPathCommand("find_file", status)
{
  this->IncludeFileInPath = true;
  this->VariableType = cmStateEnums::FILEPATH;
}